

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_clearall(CookieInfo *ci)

{
  Cookie *co;
  Cookie *pCVar1;
  Curl_llist_node *e;
  Cookie *c;
  Curl_llist_node *n;
  uint i;
  CookieInfo *ci_local;
  
  if (ci != (CookieInfo *)0x0) {
    for (n._4_4_ = 0; n._4_4_ < 0x3f; n._4_4_ = n._4_4_ + 1) {
      c = (Cookie *)Curl_llist_head(ci->cookielist + n._4_4_);
      while (c != (Cookie *)0x0) {
        co = (Cookie *)Curl_node_elem(&c->node);
        pCVar1 = (Cookie *)Curl_node_next(&c->node);
        Curl_node_remove(&c->node);
        freecookie(co);
        c = pCVar1;
      }
    }
    ci->numcookies = 0;
  }
  return;
}

Assistant:

void Curl_cookie_clearall(struct CookieInfo *ci)
{
  if(ci) {
    unsigned int i;
    for(i = 0; i < COOKIE_HASH_SIZE; i++) {
      struct Curl_llist_node *n;
      for(n = Curl_llist_head(&ci->cookielist[i]); n;) {
        struct Cookie *c = Curl_node_elem(n);
        struct Curl_llist_node *e = Curl_node_next(n);
        Curl_node_remove(n);
        freecookie(c);
        n = e;
      }
    }
    ci->numcookies = 0;
  }
}